

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O1

void __thiscall cmGlobalUnixMakefileGenerator3::Configure(cmGlobalUnixMakefileGenerator3 *this)

{
  long *local_30 [2];
  long local_20 [2];
  
  (*(this->super_cmGlobalGenerator)._vptr_cmGlobalGenerator[0x1a])(local_30,this);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  cmGlobalGenerator::Configure(&this->super_cmGlobalGenerator);
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::Configure()
{
  // Initialize CMAKE_EDIT_COMMAND cache entry.
  this->GetEditCacheCommand();

  this->cmGlobalGenerator::Configure();
}